

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * rbuObjIterGetSetlist(sqlite3rbu *p,RbuObjIter *pIter,char *zMask)

{
  char cVar1;
  size_t sVar2;
  char *pcStack_38;
  char c;
  char *zSep;
  char *pcStack_28;
  int i;
  char *zList;
  char *zMask_local;
  RbuObjIter *pIter_local;
  sqlite3rbu *p_local;
  
  pcStack_28 = (char *)0x0;
  if (p->rc == 0) {
    sVar2 = strlen(zMask);
    if ((int)sVar2 == pIter->nTblCol) {
      pcStack_38 = "";
      for (zSep._4_4_ = 0; zSep._4_4_ < pIter->nTblCol; zSep._4_4_ = zSep._4_4_ + 1) {
        cVar1 = zMask[pIter->aiSrcOrder[zSep._4_4_]];
        if (cVar1 == 'x') {
          pcStack_28 = rbuMPrintf(p,"%z%s\"%w\"=?%d",pcStack_28,pcStack_38,
                                  pIter->azTblCol[zSep._4_4_],(ulong)(zSep._4_4_ + 1));
          pcStack_38 = ", ";
        }
        else if (cVar1 == 'd') {
          pcStack_28 = rbuMPrintf(p,"%z%s\"%w\"=rbu_delta(\"%w\", ?%d)",pcStack_28,pcStack_38,
                                  pIter->azTblCol[zSep._4_4_],pIter->azTblCol[zSep._4_4_],
                                  zSep._4_4_ + 1);
          pcStack_38 = ", ";
        }
        else if (cVar1 == 'f') {
          pcStack_28 = rbuMPrintf(p,"%z%s\"%w\"=rbu_fossil_delta(\"%w\", ?%d)",pcStack_28,pcStack_38
                                  ,pIter->azTblCol[zSep._4_4_],pIter->azTblCol[zSep._4_4_],
                                  zSep._4_4_ + 1);
          pcStack_38 = ", ";
        }
      }
    }
    else {
      rbuBadControlError(p);
    }
  }
  return pcStack_28;
}

Assistant:

static char *rbuObjIterGetSetlist(
  sqlite3rbu *p,
  RbuObjIter *pIter,
  const char *zMask
){
  char *zList = 0;
  if( p->rc==SQLITE_OK ){
    int i;

    if( (int)strlen(zMask)!=pIter->nTblCol ){
      rbuBadControlError(p);
    }else{
      const char *zSep = "";
      for(i=0; i<pIter->nTblCol; i++){
        char c = zMask[pIter->aiSrcOrder[i]];
        if( c=='x' ){
          zList = rbuMPrintf(p, "%z%s\"%w\"=?%d", 
              zList, zSep, pIter->azTblCol[i], i+1
          );
          zSep = ", ";
        }
        else if( c=='d' ){
          zList = rbuMPrintf(p, "%z%s\"%w\"=rbu_delta(\"%w\", ?%d)", 
              zList, zSep, pIter->azTblCol[i], pIter->azTblCol[i], i+1
          );
          zSep = ", ";
        }
        else if( c=='f' ){
          zList = rbuMPrintf(p, "%z%s\"%w\"=rbu_fossil_delta(\"%w\", ?%d)", 
              zList, zSep, pIter->azTblCol[i], pIter->azTblCol[i], i+1
          );
          zSep = ", ";
        }
      }
    }
  }
  return zList;
}